

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<unsigned_int> * __thiscall
vkb::Device::get_dedicated_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  bool bVar1;
  uint uVar2;
  pointer pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (type == transfer) {
    pVVar3 = (this->queue_families).
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->queue_families).
                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3) *
            -0x5555555555555555;
    uVar2 = 0xffffffff;
    if ((int)uVar4 != 0) {
      uVar5 = 0;
      do {
        if ((pVVar3->queueFlags & 7) == 4) {
          uVar2 = (uint)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
        pVVar3 = pVVar3 + 1;
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
    if (uVar2 != 0xffffffff) {
LAB_0010844b:
      (__return_storage_ptr__->field_0).m_value = uVar2;
      bVar1 = true;
      goto LAB_0010846b;
    }
    (__return_storage_ptr__->field_0).m_value = 3;
  }
  else if (type == compute) {
    pVVar3 = (this->queue_families).
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->queue_families).
                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3) *
            -0x5555555555555555;
    uVar2 = 0xffffffff;
    if ((int)uVar4 != 0) {
      uVar5 = 0;
      do {
        if ((pVVar3->queueFlags & 7) == 2) {
          uVar2 = (uint)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
        pVVar3 = pVVar3 + 1;
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
    if (uVar2 != 0xffffffff) goto LAB_0010844b;
    (__return_storage_ptr__->field_0).m_value = 2;
  }
  else {
    (__return_storage_ptr__->field_0).m_value = 5;
  }
  *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  bVar1 = false;
LAB_0010846b:
  __return_storage_ptr__->m_init = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_dedicated_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::compute:
            index = detail::get_dedicated_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_dedicated_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}